

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkResult tonk_send(TonkConnection connection,void *data,uint64_t bytes,uint32_t channel)

{
  uint32_t in_ECX;
  uint64_t in_RDX;
  void *in_RSI;
  TonkConnection in_RDI;
  TonkResult local_4;
  
  if (fp_tonk_send == (fp_tonk_send_t)0x0) {
    local_4 = Tonk_DLL_Not_Found;
  }
  else {
    local_4 = (*fp_tonk_send)(in_RDI,in_RSI,in_RDX,in_ECX);
  }
  return local_4;
}

Assistant:

TonkResult tonk_send(
    TonkConnection      connection, // Connection to send on
    const void*               data, // Pointer to message data
    uint64_t                 bytes, // Message bytes
    uint32_t               channel  // Channel to attach to message
)
{
    if (!fp_tonk_send) {
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_send(
        connection,
        data,
        bytes,
        channel);
}